

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject,Transform *identity,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  pointer pcVar1;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a0;
  ParameterDictionary local_98;
  
  local_a0.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_98.params,&parameters->params,&local_a0);
  local_98.colorSpace = parameters->colorSpace;
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,name,&local_98,loc,renderFromObject);
  local_98.params.nStored = 0;
  (*(local_98.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_98.params.alloc.memoryResource,local_98.params.ptr,local_98.params.nAlloc << 3,8)
  ;
  this->identity = identity;
  this->reverseOrientation = reverseOrientation;
  this->materialIndex = materialIndex;
  (this->materialName)._M_dataplus._M_p = (pointer)&(this->materialName).field_2;
  pcVar1 = (materialName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->materialName,pcVar1,pcVar1 + materialName->_M_string_length);
  this->lightIndex = lightIndex;
  (this->insideMedium)._M_dataplus._M_p = (pointer)&(this->insideMedium).field_2;
  pcVar1 = (insideMedium->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->insideMedium,pcVar1,pcVar1 + insideMedium->_M_string_length);
  (this->outsideMedium)._M_dataplus._M_p = (pointer)&(this->outsideMedium).field_2;
  pcVar1 = (outsideMedium->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outsideMedium,pcVar1,pcVar1 + outsideMedium->_M_string_length);
  return;
}

Assistant:

AnimatedShapeSceneEntity(const std::string &name, ParameterDictionary parameters,
                             FileLoc loc, const AnimatedTransform &renderFromObject,
                             const Transform *identity, bool reverseOrientation,
                             int materialIndex, const std::string &materialName,
                             int lightIndex, const std::string &insideMedium,
                             const std::string &outsideMedium)
        : TransformedSceneEntity(name, parameters, loc, renderFromObject),
          identity(identity),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}